

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaTypeFinalContains(xmlSchemaTypePtr type,int final)

{
  int final_local;
  xmlSchemaTypePtr type_local;
  
  if (type == (xmlSchemaTypePtr)0x0) {
    type_local._4_4_ = 0;
  }
  else if ((type->flags & final) == 0) {
    type_local._4_4_ = 0;
  }
  else {
    type_local._4_4_ = 1;
  }
  return type_local._4_4_;
}

Assistant:

static int
xmlSchemaTypeFinalContains(xmlSchemaTypePtr type, int final)
{
    if (type == NULL)
	return (0);
    if (type->flags & final)
	return (1);
    else
	return (0);
}